

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OffsetInputSource.cc
# Opt level: O1

void __thiscall
OffsetInputSource::OffsetInputSource
          (OffsetInputSource *this,shared_ptr<InputSource> *proxied,qpdf_offset_t global_offset)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  logic_error *this_00;
  
  (this->super_InputSource).last_offset = 0;
  (this->super_InputSource).buf_len = 0;
  (this->super_InputSource).buf_idx = 0;
  (this->super_InputSource).buf_start = 0;
  (this->super_InputSource)._vptr_InputSource = (_func_int **)&PTR__OffsetInputSource_002f3110;
  (this->proxied).super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (proxied->super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (proxied->super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (this->proxied).super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  this->global_offset = global_offset;
  if (-1 < global_offset) {
    this->max_safe_offset = global_offset ^ 0x7fffffffffffffff;
    return;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,"OffsetInputSource constructed with negative offset");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

OffsetInputSource::OffsetInputSource(
    std::shared_ptr<InputSource> proxied, qpdf_offset_t global_offset) :
    proxied(proxied),
    global_offset(global_offset)
{
    if (global_offset < 0) {
        throw std::logic_error("OffsetInputSource constructed with negative offset");
    }
    this->max_safe_offset = std::numeric_limits<qpdf_offset_t>::max() - global_offset;
}